

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_curv_edge_curvatures_dim<2>
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_tangents,
          LOs *curv_vert2vert,Reals *curv_vert_tangents)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  Read<int> local_2b8;
  Read<double> local_2a8;
  Write<double> local_298;
  undefined1 local_288 [8];
  Reals curv_edges2curvature;
  type f;
  Reals coords;
  Adj local_1d8;
  undefined1 local_1a8 [8];
  Read<signed_char> ev_flips;
  Read<int> local_168;
  undefined1 local_158 [8];
  Adj curv_verts2edges;
  Adj verts2edges;
  string local_f0 [32];
  undefined1 local_d0 [8];
  Write<double> curv_edges2curvature_w;
  undefined1 local_b8 [4];
  LO ncurv_edges;
  LOs edges2verts;
  undefined1 local_98 [8];
  LOs edge2curv_edge;
  Read<int> local_78;
  undefined1 local_68 [8];
  LOs vert2curv_vert;
  Reals *curv_vert_tangents_local;
  LOs *curv_vert2vert_local;
  Reals *curv_edge_tangents_local;
  LOs *curv_edge2edge_local;
  Mesh *mesh_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  vert2curv_vert.write_.shared_alloc_.direct_ptr = curv_vert_tangents;
  Read<int>::Read(&local_78,curv_vert2vert);
  LVar1 = Mesh::nverts(mesh);
  invert_injective_map((Omega_h *)local_68,&local_78,LVar1);
  Read<int>::~Read(&local_78);
  Read<int>::Read((Read<int> *)&edges2verts.write_.shared_alloc_.direct_ptr,curv_edge2edge);
  LVar1 = Mesh::nedges(mesh);
  invert_injective_map
            ((Omega_h *)local_98,(LOs *)&edges2verts.write_.shared_alloc_.direct_ptr,LVar1);
  Read<int>::~Read((Read<int> *)&edges2verts.write_.shared_alloc_.direct_ptr);
  Mesh::ask_verts_of((Mesh *)local_b8,(Int)mesh);
  if (((ulong)(curv_edge2edge->write_).shared_alloc_.alloc & 1) == 0) {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((curv_edge2edge->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((ulong)(curv_edge2edge->write_).shared_alloc_.alloc >> 3);
  }
  LVar1 = (LO)((ulong)local_10._M_pi >> 2);
  curv_edges2curvature_w.shared_alloc_.direct_ptr._4_4_ = LVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f0,"",(allocator *)((long)&verts2edges.codes.write_.shared_alloc_.direct_ptr + 7)
            );
  Write<double>::Write((Write<double> *)local_d0,LVar1,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&verts2edges.codes.write_.shared_alloc_.direct_ptr + 7));
  Mesh::ask_up((Adj *)&curv_verts2edges.codes.write_.shared_alloc_.direct_ptr,mesh,0,1);
  Read<int>::Read(&local_168,curv_vert2vert);
  Adj::Adj((Adj *)&ev_flips.write_.shared_alloc_.direct_ptr,
           (Adj *)&curv_verts2edges.codes.write_.shared_alloc_.direct_ptr);
  unmap_adjacency((Adj *)local_158,&local_168,(Adj *)&ev_flips.write_.shared_alloc_.direct_ptr);
  Adj::~Adj((Adj *)&ev_flips.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_168);
  Adj::Adj(&local_1d8,(Adj *)local_158);
  Read<int>::Read((Read<int> *)&coords.write_.shared_alloc_.direct_ptr,(Read<int> *)local_98);
  get_curv_edge_vert_flips
            ((Omega_h *)local_1a8,mesh,&local_1d8,(LOs *)&coords.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&coords.write_.shared_alloc_.direct_ptr);
  Adj::~Adj(&local_1d8);
  Mesh::coords((Mesh *)&f.curv_edges2curvature_w.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&curv_edges2curvature.write_.shared_alloc_.direct_ptr,curv_edge2edge)
  ;
  Read<double>::Read((Read<double> *)&f.curv_edge2edge.write_.shared_alloc_.direct_ptr,
                     curv_edge_tangents);
  Read<int>::Read((Read<int> *)&f.curv_edge_tangents.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_b8);
  Read<int>::Read((Read<int> *)&f.edges2verts.write_.shared_alloc_.direct_ptr,(Read<int> *)local_68)
  ;
  Read<double>::Read((Read<double> *)&f.vert2curv_vert.write_.shared_alloc_.direct_ptr,
                     curv_vert_tangents);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.curv_vert_tangents.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_1a8);
  Read<double>::Read((Read<double> *)&f.ev_flips.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&f.curv_edges2curvature_w.shared_alloc_.direct_ptr);
  Write<double>::Write
            ((Write<double> *)&f.coords.write_.shared_alloc_.direct_ptr,(Write<double> *)local_d0);
  parallel_for<Omega_h::get_curv_edge_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (curv_edges2curvature_w.shared_alloc_.direct_ptr._4_4_,
             (type *)&curv_edges2curvature.write_.shared_alloc_.direct_ptr,
             "get_curv_edge_curvatures");
  Write<double>::Write(&local_298,(Write<double> *)local_d0);
  Read<double>::Read((Read<double> *)local_288,&local_298);
  Write<double>::~Write(&local_298);
  Read<double>::Read(&local_2a8,(Read<double> *)local_288);
  Read<int>::Read(&local_2b8,curv_edge2edge);
  Mesh::sync_subset_array<double>
            ((Mesh *)this,(Int)mesh,(Read<double> *)0x1,(LOs *)&local_2a8,0.0,(Int)&local_2b8);
  Read<int>::~Read(&local_2b8);
  Read<double>::~Read(&local_2a8);
  Read<double>::~Read((Read<double> *)local_288);
  get_curv_edge_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<double>)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&curv_edges2curvature.write_.shared_alloc_.direct_ptr)
  ;
  Read<double>::~Read((Read<double> *)&f.curv_edges2curvature_w.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)local_1a8);
  Adj::~Adj((Adj *)local_158);
  Adj::~Adj((Adj *)&curv_verts2edges.codes.write_.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_d0);
  Read<int>::~Read((Read<int> *)local_b8);
  Read<int>::~Read((Read<int> *)local_98);
  Read<int>::~Read((Read<int> *)local_68);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_curv_edge_curvatures_dim(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_tangents, LOs curv_vert2vert, Reals curv_vert_tangents) {
  auto vert2curv_vert = invert_injective_map(curv_vert2vert, mesh->nverts());
  auto edge2curv_edge = invert_injective_map(curv_edge2edge, mesh->nedges());
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto ncurv_edges = curv_edge2edge.size();
  auto curv_edges2curvature_w = Write<Real>(ncurv_edges);
  auto verts2edges = mesh->ask_up(VERT, EDGE);
  auto curv_verts2edges = unmap_adjacency(curv_vert2vert, verts2edges);
  auto ev_flips =
      get_curv_edge_vert_flips(mesh, curv_verts2edges, edge2curv_edge);
  auto coords = mesh->coords();
  auto f = OMEGA_H_LAMBDA(LO curv_edge) {
    auto edge = curv_edge2edge[curv_edge];
    auto et = get_vector<dim>(curv_edge_tangents, curv_edge);
    Few<Vector<dim>, 2> ts;
    auto eev2v = gather_verts<2>(edges2verts, edge);
    for (Int eev = 0; eev < 2; ++eev) {
      auto vert = eev2v[eev];
      auto curv_vert = vert2curv_vert[vert];
      Vector<dim> vt;
      if (curv_vert >= 0) {
        vt = get_vector<dim>(curv_vert_tangents, curv_vert);
        if (ev_flips[edge * 2 + eev]) vt = -vt;
      } else {
        vt = et;
      }
      ts[eev] = vt;
    }
    auto p = gather_vectors<2, dim>(coords, eev2v);
    auto e = p[1] - p[0];
    auto l = norm(e);
    auto u = e / l;
    auto dt = ts[1] - ts[0];
    auto curvature = norm(dt - (u * (dt * u))) / l;
    curv_edges2curvature_w[curv_edge] = curvature;
  };
  parallel_for(ncurv_edges, f, "get_curv_edge_curvatures");
  auto curv_edges2curvature = Reals(curv_edges2curvature_w);
  return mesh->sync_subset_array(
      EDGE, curv_edges2curvature, curv_edge2edge, 0.0, 1);
}